

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# apngasm.cpp
# Opt level: O2

void __thiscall
apngasm::APNGAsm::APNGAsm
          (APNGAsm *this,vector<apngasm::APNGFrame,_std::allocator<apngasm::APNGFrame>_> *frames)

{
  *(undefined8 *)
   ((long)&(this->_frames).
           super__Vector_base<apngasm::APNGFrame,_std::allocator<apngasm::APNGFrame>_>._M_impl.
           super__Vector_impl_data._M_finish + 5) = 0;
  *(undefined8 *)
   ((long)&(this->_frames).
           super__Vector_base<apngasm::APNGFrame,_std::allocator<apngasm::APNGFrame>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage + 5) = 0;
  (this->_frames).super__Vector_base<apngasm::APNGFrame,_std::allocator<apngasm::APNGFrame>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->_frames).super__Vector_base<apngasm::APNGFrame,_std::allocator<apngasm::APNGFrame>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  this->_listener = (IAPNGAsmListener *)&::(anonymous_namespace)::defaultListener;
  (this->_info_chunks).super__Vector_base<apngasm::CHUNK,_std::allocator<apngasm::CHUNK>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->_info_chunks).super__Vector_base<apngasm::CHUNK,_std::allocator<apngasm::CHUNK>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->_info_chunks).super__Vector_base<apngasm::CHUNK,_std::allocator<apngasm::CHUNK>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  std::vector<apngasm::APNGFrame,std::allocator<apngasm::APNGFrame>>::
  insert<__gnu_cxx::__normal_iterator<apngasm::APNGFrame_const*,std::vector<apngasm::APNGFrame,std::allocator<apngasm::APNGFrame>>>,void>
            ((vector<apngasm::APNGFrame,std::allocator<apngasm::APNGFrame>> *)this,
             (const_iterator)0x0,
             (frames->super__Vector_base<apngasm::APNGFrame,_std::allocator<apngasm::APNGFrame>_>).
             _M_impl.super__Vector_impl_data._M_start,
             (frames->super__Vector_base<apngasm::APNGFrame,_std::allocator<apngasm::APNGFrame>_>).
             _M_impl.super__Vector_impl_data._M_finish);
  return;
}

Assistant:

APNGAsm::APNGAsm(const std::vector<APNGFrame> &frames)
    : _listener(&defaultListener)
    , _loops(0)
    , _skipFirst(false)
  {
    _frames.insert(_frames.end(), frames.begin(), frames.end());
  }